

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinfl_decompress_mem_to_callback
              (void *pIn_buf,size_t *pIn_buf_size,tinfl_put_buf_func_ptr pPut_buf_func,
              void *pPut_buf_user,int flags)

{
  bool bVar1;
  tinfl_status tVar2;
  int iVar3;
  uint uVar4;
  mz_uint8 *pOut_buf_start;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  size_t dst_buf_size;
  size_t in_buf_size;
  tinfl_decompressor decomp;
  size_t local_2b50;
  size_t local_2b48;
  tinfl_put_buf_func_ptr local_2b40;
  void *local_2b38;
  void *local_2b30;
  tinfl_decompressor local_2b28;
  
  local_2b40 = pPut_buf_func;
  local_2b38 = pPut_buf_user;
  local_2b30 = pIn_buf;
  pOut_buf_start = (mz_uint8 *)malloc(0x8000);
  if (pOut_buf_start == (mz_uint8 *)0x0) {
    uVar4 = 0xffffffff;
  }
  else {
    local_2b28.m_state = 0;
    uVar4 = 0;
    sVar5 = 0;
    uVar6 = 0;
    do {
      local_2b48 = *pIn_buf_size - sVar5;
      local_2b50 = 0x8000 - uVar6;
      tVar2 = tinfl_decompress(&local_2b28,(mz_uint8 *)((long)local_2b30 + sVar5),&local_2b48,
                               pOut_buf_start,pOut_buf_start + uVar6,&local_2b50,flags & 0xfffffff9)
      ;
      sVar5 = sVar5 + local_2b48;
      iVar7 = (int)local_2b50;
      if (local_2b50 == 0) {
LAB_0017271c:
        if (tVar2 != TINFL_STATUS_HAS_MORE_OUTPUT) {
          uVar4 = (uint)(tVar2 == TINFL_STATUS_DONE);
          goto LAB_0017273e;
        }
        uVar6 = (ulong)(iVar7 + (int)uVar6 & 0x7fff);
        bVar1 = true;
      }
      else {
        iVar3 = (*local_2b40)(pOut_buf_start + uVar6,iVar7,local_2b38);
        if (iVar3 != 0) goto LAB_0017271c;
LAB_0017273e:
        bVar1 = false;
      }
    } while (bVar1);
    free(pOut_buf_start);
    *pIn_buf_size = sVar5;
  }
  return uVar4;
}

Assistant:

int tinfl_decompress_mem_to_callback(const void *pIn_buf, size_t *pIn_buf_size,
                                     tinfl_put_buf_func_ptr pPut_buf_func,
                                     void *pPut_buf_user, int flags) {
  int result = 0;
  tinfl_decompressor decomp;
  mz_uint8 *pDict = (mz_uint8 *)MZ_MALLOC(TINFL_LZ_DICT_SIZE);
  size_t in_buf_ofs = 0, dict_ofs = 0;
  if (!pDict)
    return TINFL_STATUS_FAILED;
  tinfl_init(&decomp);
  for (;;) {
    size_t in_buf_size = *pIn_buf_size - in_buf_ofs,
           dst_buf_size = TINFL_LZ_DICT_SIZE - dict_ofs;
    tinfl_status status =
        tinfl_decompress(&decomp, (const mz_uint8 *)pIn_buf + in_buf_ofs,
                         &in_buf_size, pDict, pDict + dict_ofs, &dst_buf_size,
                         (flags &
                          ~(TINFL_FLAG_HAS_MORE_INPUT |
                            TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)));
    in_buf_ofs += in_buf_size;
    if ((dst_buf_size) &&
        (!(*pPut_buf_func)(pDict + dict_ofs, (int)dst_buf_size, pPut_buf_user)))
      break;
    if (status != TINFL_STATUS_HAS_MORE_OUTPUT) {
      result = (status == TINFL_STATUS_DONE);
      break;
    }
    dict_ofs = (dict_ofs + dst_buf_size) & (TINFL_LZ_DICT_SIZE - 1);
  }
  MZ_FREE(pDict);
  *pIn_buf_size = in_buf_ofs;
  return result;
}